

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

BasicBlock * __thiscall
mocker::ir::FunctionModule::getBasicBlock(FunctionModule *this,size_t labelID)

{
  reference_wrapper *this_00;
  BasicBlock *pBVar1;
  size_t local_18;
  size_t labelID_local;
  FunctionModule *this_local;
  
  local_18 = labelID;
  labelID_local = (size_t)this;
  this_00 = (reference_wrapper *)
            std::
            unordered_map<unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>_>_>
            ::at(&this->bbMap,&local_18);
  pBVar1 = std::reference_wrapper::operator_cast_to_BasicBlock_(this_00);
  return pBVar1;
}

Assistant:

const BasicBlock &FunctionModule::getBasicBlock(std::size_t labelID) const {
  return bbMap.at(labelID);
}